

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffgpvb(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,uchar nulval,uchar *array,
          int *anynul,int *status)

{
  int iVar1;
  int *in_stack_00000010;
  uchar nullvalue;
  int nullcheck;
  char cdummy;
  long row;
  void *in_stack_000000f0;
  int in_stack_000000fc;
  LONGLONG in_stack_00000100;
  LONGLONG in_stack_00000108;
  int in_stack_00000114;
  fitsfile *in_stack_00000118;
  void *in_stack_00000160;
  char *in_stack_00000168;
  int *in_stack_00000170;
  int *in_stack_00000178;
  long in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  LONGLONG in_stack_00007248;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  int in_stack_000072a0;
  uchar in_stack_000072a8;
  uchar *in_stack_000072b0;
  char *in_stack_000072b8;
  int *in_stack_000072c0;
  int *in_stack_000072c8;
  fitsfile *in_stack_ffffffffffffff68;
  int local_14;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff68,(int *)0x1987f3);
  if (iVar1 == 0) {
    ffgclb(in_stack_00007258,in_stack_00007254,in_stack_00007248,in_stack_00007240,in_stack_00007238
           ,in_stack_00007230,in_stack_000072a0,in_stack_000072a8,in_stack_000072b0,
           in_stack_000072b8,in_stack_000072c0,in_stack_000072c8);
    local_14 = *in_stack_00000010;
  }
  else {
    fits_read_compressed_pixels
              (in_stack_00000118,in_stack_00000114,in_stack_00000108,in_stack_00000100,
               in_stack_000000fc,in_stack_000000f0,in_stack_00000160,in_stack_00000168,
               in_stack_00000170,in_stack_00000178);
    local_14 = *in_stack_00000010;
  }
  return local_14;
}

Assistant:

int ffgpvb( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            unsigned char nulval, /* I - value for undefined pixels          */
            unsigned char *array, /* O - array of values that are returned   */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    char cdummy;
    int nullcheck = 1;
    unsigned char nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
         nullvalue = nulval;  /* set local variable */

        fits_read_compressed_pixels(fptr, TBYTE, firstelem, nelem,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclb(fptr, 2, row, firstelem, nelem, 1, 1, nulval,
               array, &cdummy, anynul, status);
    return(*status);
}